

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::CFIReaderImpl::parseHeader(CFIReaderImpl *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *stringTable;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t *data;
  byte *pbVar5;
  undefined8 *puVar6;
  char **ppcVar7;
  shared_ptr<const_Assimp::FIValue> *psVar8;
  FIQName *pFVar9;
  size_t sVar10;
  iterator iVar11;
  DeadlyImportError *pDVar12;
  byte *pbVar13;
  bool bVar14;
  string uri;
  undefined1 local_c0 [48];
  string local_90;
  string local_70;
  string local_50;
  
  data = this->dataP;
  pbVar5 = this->dataEnd;
  sVar10 = parseMagic(data,pbVar5);
  if (sVar10 == 0) {
    pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
  }
  else {
    pbVar13 = data + sVar10;
    this->dataP = pbVar13;
    if (pbVar5 == pbVar13 || (long)pbVar5 - (long)pbVar13 < 0) {
      pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
    }
    else {
      this->dataP = pbVar13 + 1;
      bVar2 = *pbVar13;
      if ((bVar2 & 0x40) != 0) {
        sVar10 = parseSequenceLen(this);
        while (bVar14 = sVar10 != 0, sVar10 = sVar10 - 1, bVar14) {
          if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
            pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
            goto LAB_00550cc9;
          }
          parseNonEmptyOctetString2_abi_cxx11_(&local_50,this);
          std::__cxx11::string::~string((string *)&local_50);
          if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
            pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
            goto LAB_00550cc9;
          }
          parseNonEmptyOctetString2_abi_cxx11_(&local_70,this);
          std::__cxx11::string::~string((string *)&local_70);
        }
      }
      if ((bVar2 & 0x20) != 0) {
        pbVar5 = this->dataP;
        if ((long)this->dataEnd - (long)pbVar5 < 2) {
          pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
          goto LAB_00550cc9;
        }
        bVar3 = *pbVar5;
        bVar4 = pbVar5[1];
        this->dataP = pbVar5 + 2;
        if ((bVar3 & 0x10) != 0) {
          if ((long)this->dataEnd - (long)(pbVar5 + 2) < 1) {
            pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
            goto LAB_00550cc9;
          }
          parseNonEmptyOctetString2_abi_cxx11_(&uri,this);
          iVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FIVocabulary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FIVocabulary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FIVocabulary_*>_>_>
                   ::find(&(this->vocabularyMap)._M_t,&uri);
          if ((_Rb_tree_header *)iVar11._M_node ==
              &(this->vocabularyMap)._M_t._M_impl.super__Rb_tree_header) {
            pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_c0 + 0x10),"Unknown vocabulary ",&uri);
            DeadlyImportError::DeadlyImportError(pDVar12,(string *)(local_c0 + 0x10));
            __cxa_throw(pDVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          puVar6 = *(undefined8 **)(iVar11._M_node + 2);
          ppcVar7 = (char **)*puVar6;
          if (ppcVar7 != (char **)0x0) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (ppcVar7,ppcVar7 + puVar6[1],
                       (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )&this->vocabulary);
          }
          ppcVar7 = (char **)puVar6[2];
          if (ppcVar7 != (char **)0x0) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (ppcVar7,ppcVar7 + puVar6[3],
                       (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )&(this->vocabulary).encodingAlgorithmTable);
          }
          ppcVar7 = (char **)puVar6[4];
          if (ppcVar7 != (char **)0x0) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (ppcVar7,ppcVar7 + puVar6[5],
                       (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )&(this->vocabulary).prefixTable);
          }
          ppcVar7 = (char **)puVar6[6];
          if (ppcVar7 != (char **)0x0) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (ppcVar7,ppcVar7 + puVar6[7],
                       (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )&(this->vocabulary).namespaceNameTable);
          }
          ppcVar7 = (char **)puVar6[8];
          if (ppcVar7 != (char **)0x0) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (ppcVar7,ppcVar7 + puVar6[9],
                       (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )&(this->vocabulary).localNameTable);
          }
          ppcVar7 = (char **)puVar6[10];
          if (ppcVar7 != (char **)0x0) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (ppcVar7,ppcVar7 + puVar6[0xb],
                       (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )&(this->vocabulary).otherNCNameTable);
          }
          ppcVar7 = (char **)puVar6[0xc];
          if (ppcVar7 != (char **)0x0) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const**,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (ppcVar7,ppcVar7 + puVar6[0xd],
                       (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )&(this->vocabulary).otherURITable);
          }
          psVar8 = (shared_ptr<const_Assimp::FIValue> *)puVar6[0xe];
          if (psVar8 != (shared_ptr<const_Assimp::FIValue> *)0x0) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<std::shared_ptr<Assimp::FIValue_const>const*,std::back_insert_iterator<std::vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>>>
                      (psVar8,psVar8 + puVar6[0xf],
                       (back_insert_iterator<std::vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>_>
                        )&(this->vocabulary).attributeValueTable);
          }
          psVar8 = (shared_ptr<const_Assimp::FIValue> *)puVar6[0x10];
          if (psVar8 != (shared_ptr<const_Assimp::FIValue> *)0x0) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<std::shared_ptr<Assimp::FIValue_const>const*,std::back_insert_iterator<std::vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>>>
                      (psVar8,psVar8 + puVar6[0x11],
                       (back_insert_iterator<std::vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>_>
                        )&(this->vocabulary).charactersTable);
          }
          psVar8 = (shared_ptr<const_Assimp::FIValue> *)puVar6[0x12];
          if (psVar8 != (shared_ptr<const_Assimp::FIValue> *)0x0) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<std::shared_ptr<Assimp::FIValue_const>const*,std::back_insert_iterator<std::vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>>>
                      (psVar8,psVar8 + puVar6[0x13],
                       (back_insert_iterator<std::vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>_>
                        )&(this->vocabulary).otherStringTable);
          }
          pFVar9 = (FIQName *)puVar6[0x14];
          if (pFVar9 != (FIQName *)0x0) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<Assimp::FIQName_const*,std::back_insert_iterator<std::vector<Assimp::CFIReaderImpl::QName,std::allocator<Assimp::CFIReaderImpl::QName>>>>
                      (pFVar9,pFVar9 + puVar6[0x15],
                       (back_insert_iterator<std::vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>_>
                        )&(this->vocabulary).elementNameTable);
          }
          pFVar9 = (FIQName *)puVar6[0x16];
          if (pFVar9 != (FIQName *)0x0) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<Assimp::FIQName_const*,std::back_insert_iterator<std::vector<Assimp::CFIReaderImpl::QName,std::allocator<Assimp::CFIReaderImpl::QName>>>>
                      (pFVar9,pFVar9 + puVar6[0x17],
                       (back_insert_iterator<std::vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>_>
                        )&(this->vocabulary).attributeNameTable);
          }
          std::__cxx11::string::~string((string *)&uri);
        }
        if ((bVar3 & 8) != 0) {
          sVar10 = parseSequenceLen(this);
          while (bVar14 = sVar10 != 0, sVar10 = sVar10 - 1, bVar14) {
            if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
              pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
              goto LAB_00550cc9;
            }
            parseNonEmptyOctetString2_abi_cxx11_(&uri,this);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->vocabulary,&uri);
            std::__cxx11::string::~string((string *)&uri);
          }
        }
        if ((bVar3 & 4) != 0) {
          sVar10 = parseSequenceLen(this);
          while (bVar14 = sVar10 != 0, sVar10 = sVar10 - 1, bVar14) {
            if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
              pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
              goto LAB_00550cc9;
            }
            parseNonEmptyOctetString2_abi_cxx11_(&uri,this);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &(this->vocabulary).encodingAlgorithmTable,&uri);
            std::__cxx11::string::~string((string *)&uri);
          }
        }
        if ((bVar3 & 2) != 0) {
          sVar10 = parseSequenceLen(this);
          while (bVar14 = sVar10 != 0, sVar10 = sVar10 - 1, bVar14) {
            if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
              pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
              goto LAB_00550cc9;
            }
            parseNonEmptyOctetString2_abi_cxx11_(&uri,this);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &(this->vocabulary).prefixTable,&uri);
            std::__cxx11::string::~string((string *)&uri);
          }
        }
        if ((bVar3 & 1) != 0) {
          sVar10 = parseSequenceLen(this);
          while (bVar14 = sVar10 != 0, sVar10 = sVar10 - 1, bVar14) {
            if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
              pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
              goto LAB_00550cc9;
            }
            parseNonEmptyOctetString2_abi_cxx11_(&uri,this);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &(this->vocabulary).namespaceNameTable,&uri);
            std::__cxx11::string::~string((string *)&uri);
          }
        }
        if ((char)bVar4 < '\0') {
          sVar10 = parseSequenceLen(this);
          while (bVar14 = sVar10 != 0, sVar10 = sVar10 - 1, bVar14) {
            if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
              pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
              goto LAB_00550cc9;
            }
            parseNonEmptyOctetString2_abi_cxx11_(&uri,this);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &(this->vocabulary).localNameTable,&uri);
            std::__cxx11::string::~string((string *)&uri);
          }
        }
        if ((bVar4 & 0x40) != 0) {
          sVar10 = parseSequenceLen(this);
          while (bVar14 = sVar10 != 0, sVar10 = sVar10 - 1, bVar14) {
            if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
              pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
              goto LAB_00550cc9;
            }
            parseNonEmptyOctetString2_abi_cxx11_(&uri,this);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &(this->vocabulary).otherNCNameTable,&uri);
            std::__cxx11::string::~string((string *)&uri);
          }
        }
        if ((bVar4 & 0x20) != 0) {
          sVar10 = parseSequenceLen(this);
          while (bVar14 = sVar10 != 0, sVar10 = sVar10 - 1, bVar14) {
            if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
              pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
              goto LAB_00550cc9;
            }
            parseNonEmptyOctetString2_abi_cxx11_(&uri,this);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &(this->vocabulary).otherURITable,&uri);
            std::__cxx11::string::~string((string *)&uri);
          }
        }
        if ((bVar4 & 0x10) != 0) {
          sVar10 = parseSequenceLen(this);
          while (bVar14 = sVar10 != 0, sVar10 = sVar10 - 1, bVar14) {
            if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
              pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
              goto LAB_00550cc9;
            }
            parseEncodedCharacterString3((CFIReaderImpl *)&uri);
            std::
            vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>
            ::emplace_back<std::shared_ptr<Assimp::FIValue_const>>
                      ((vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>
                        *)&(this->vocabulary).attributeValueTable,
                       (shared_ptr<const_Assimp::FIValue> *)&uri);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&uri._M_string_length);
          }
        }
        if ((bVar4 & 8) != 0) {
          sVar10 = parseSequenceLen(this);
          while (bVar14 = sVar10 != 0, sVar10 = sVar10 - 1, bVar14) {
            if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
              pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
              goto LAB_00550cc9;
            }
            parseEncodedCharacterString3((CFIReaderImpl *)&uri);
            std::
            vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>
            ::emplace_back<std::shared_ptr<Assimp::FIValue_const>>
                      ((vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>
                        *)&(this->vocabulary).charactersTable,
                       (shared_ptr<const_Assimp::FIValue> *)&uri);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&uri._M_string_length);
          }
        }
        if ((bVar4 & 4) != 0) {
          sVar10 = parseSequenceLen(this);
          while (bVar14 = sVar10 != 0, sVar10 = sVar10 - 1, bVar14) {
            if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
              pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
              goto LAB_00550cc9;
            }
            parseEncodedCharacterString3((CFIReaderImpl *)&uri);
            std::
            vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>
            ::emplace_back<std::shared_ptr<Assimp::FIValue_const>>
                      ((vector<std::shared_ptr<Assimp::FIValue_const>,std::allocator<std::shared_ptr<Assimp::FIValue_const>>>
                        *)&(this->vocabulary).otherStringTable,
                       (shared_ptr<const_Assimp::FIValue> *)&uri);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&uri._M_string_length);
          }
        }
        if ((bVar4 & 2) != 0) {
          sVar10 = parseSequenceLen(this);
          while (bVar14 = sVar10 != 0, sVar10 = sVar10 - 1, bVar14) {
            parseNameSurrogate((QName *)&uri,this);
            std::vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
            ::emplace_back<Assimp::CFIReaderImpl::QName>
                      (&(this->vocabulary).elementNameTable,(QName *)&uri);
            QName::~QName((QName *)&uri);
          }
        }
        if ((bVar4 & 1) != 0) {
          sVar10 = parseSequenceLen(this);
          while (bVar14 = sVar10 != 0, sVar10 = sVar10 - 1, bVar14) {
            parseNameSurrogate((QName *)&uri,this);
            std::vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
            ::emplace_back<Assimp::CFIReaderImpl::QName>
                      (&(this->vocabulary).attributeNameTable,(QName *)&uri);
            QName::~QName((QName *)&uri);
          }
        }
      }
      if ((bVar2 & 0x10) == 0) {
LAB_00550519:
        if ((bVar2 & 8) == 0) {
LAB_00550523:
          if ((bVar2 & 4) != 0) {
            if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
              pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
              goto LAB_00550cc9;
            }
            parseNonEmptyOctetString2_abi_cxx11_(&local_90,this);
            std::__cxx11::string::~string((string *)&local_90);
          }
          if ((bVar2 & 2) != 0) {
            pbVar5 = this->dataP;
            if ((long)this->dataEnd - (long)pbVar5 < 1) {
              pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
              goto LAB_00550cc9;
            }
            this->dataP = pbVar5 + 1;
            if (1 < *pbVar5) {
              pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
              goto LAB_00550cc9;
            }
          }
          if ((bVar2 & 1) != 0) {
            if (this->dataEnd == this->dataP || (long)this->dataEnd - (long)this->dataP < 0) {
              pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
              goto LAB_00550cc9;
            }
            parseNonIdentifyingStringOrIndex1
                      ((CFIReaderImpl *)local_c0,
                       (vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                        *)this);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
          }
          return;
        }
        pvVar1 = &(this->vocabulary).otherNCNameTable;
        stringTable = &(this->vocabulary).otherURITable;
        while( true ) {
          pbVar5 = this->dataP;
          if ((long)this->dataEnd - (long)pbVar5 < 1) break;
          this->dataP = pbVar5 + 1;
          bVar3 = *pbVar5;
          if (bVar3 == 0xf0) goto LAB_00550523;
          if ((bVar3 & 0xfe) != 0xd0) {
            pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
            goto LAB_00550cc9;
          }
          parseIdentifyingStringOrIndex(this,pvVar1);
          parseIdentifyingStringOrIndex(this,stringTable);
          if ((bVar3 & 1) != 0) {
            parseIdentifyingStringOrIndex(this,stringTable);
          }
          parseIdentifyingStringOrIndex(this,pvVar1);
        }
        pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
      }
      else {
        pvVar1 = &(this->vocabulary).otherURITable;
        while( true ) {
          pbVar5 = this->dataP;
          if ((long)this->dataEnd - (long)pbVar5 < 1) break;
          this->dataP = pbVar5 + 1;
          bVar3 = *pbVar5;
          if (bVar3 == 0xf0) goto LAB_00550519;
          if ((bVar3 & 0xfc) != 0xc0) {
            pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
            goto LAB_00550cc9;
          }
          parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherNCNameTable);
          if ((bVar3 & 2) != 0) {
            parseIdentifyingStringOrIndex(this,pvVar1);
          }
          if ((bVar3 & 1) != 0) {
            parseIdentifyingStringOrIndex(this,pvVar1);
          }
        }
        pDVar12 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        DeadlyImportError::DeadlyImportError(pDVar12,(string *)parseErrorMessage_abi_cxx11_);
      }
    }
  }
LAB_00550cc9:
  __cxa_throw(pDVar12,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parseHeader() {
        // Parse header (C.1.3)
        size_t magicSize = parseMagic(dataP, dataEnd);
        if (!magicSize) {
            throw DeadlyImportError(parseErrorMessage);
        }
        dataP += magicSize;
        // C.2.3
        if (dataEnd - dataP < 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        uint8_t b = *dataP++;
        if (b & 0x40) {
            // Parse additional data (C.2.4)
            size_t len = parseSequenceLen();
            for (size_t i = 0; i < len; ++i) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                /*std::string id =*/ parseNonEmptyOctetString2();
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                /*std::string data =*/ parseNonEmptyOctetString2();
            }
        }
        if (b & 0x20) {
            // Parse initial vocabulary (C.2.5)
            if (dataEnd - dataP < 2) {
                throw DeadlyImportError(parseErrorMessage);
            }
            uint16_t b1 = (dataP[0] << 8) | dataP[1];
            dataP += 2;
            if (b1 & 0x1000) {
                // External vocabulary (C.2.5.2)
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                std::string uri = parseNonEmptyOctetString2();
                auto it = vocabularyMap.find(uri);
                if (it == vocabularyMap.end()) {
                    throw DeadlyImportError("Unknown vocabulary " + uri);
                }
                const FIVocabulary *externalVocabulary = it->second;
                if (externalVocabulary->restrictedAlphabetTable) {
                    std::copy(externalVocabulary->restrictedAlphabetTable, externalVocabulary->restrictedAlphabetTable + externalVocabulary->restrictedAlphabetTableSize, std::back_inserter(vocabulary.restrictedAlphabetTable));
                }
                if (externalVocabulary->encodingAlgorithmTable) {
                    std::copy(externalVocabulary->encodingAlgorithmTable, externalVocabulary->encodingAlgorithmTable + externalVocabulary->encodingAlgorithmTableSize, std::back_inserter(vocabulary.encodingAlgorithmTable));
                }
                if (externalVocabulary->prefixTable) {
                    std::copy(externalVocabulary->prefixTable, externalVocabulary->prefixTable + externalVocabulary->prefixTableSize, std::back_inserter(vocabulary.prefixTable));
                }
                if (externalVocabulary->namespaceNameTable) {
                    std::copy(externalVocabulary->namespaceNameTable, externalVocabulary->namespaceNameTable + externalVocabulary->namespaceNameTableSize, std::back_inserter(vocabulary.namespaceNameTable));
                }
                if (externalVocabulary->localNameTable) {
                    std::copy(externalVocabulary->localNameTable, externalVocabulary->localNameTable + externalVocabulary->localNameTableSize, std::back_inserter(vocabulary.localNameTable));
                }
                if (externalVocabulary->otherNCNameTable) {
                    std::copy(externalVocabulary->otherNCNameTable, externalVocabulary->otherNCNameTable + externalVocabulary->otherNCNameTableSize, std::back_inserter(vocabulary.otherNCNameTable));
                }
                if (externalVocabulary->otherURITable) {
                    std::copy(externalVocabulary->otherURITable, externalVocabulary->otherURITable + externalVocabulary->otherURITableSize, std::back_inserter(vocabulary.otherURITable));
                }
                if (externalVocabulary->attributeValueTable) {
                    std::copy(externalVocabulary->attributeValueTable, externalVocabulary->attributeValueTable + externalVocabulary->attributeValueTableSize, std::back_inserter(vocabulary.attributeValueTable));
                }
                if (externalVocabulary->charactersTable) {
                    std::copy(externalVocabulary->charactersTable, externalVocabulary->charactersTable + externalVocabulary->charactersTableSize, std::back_inserter(vocabulary.charactersTable));
                }
                if (externalVocabulary->otherStringTable) {
                    std::copy(externalVocabulary->otherStringTable, externalVocabulary->otherStringTable + externalVocabulary->otherStringTableSize, std::back_inserter(vocabulary.otherStringTable));
                }
                if (externalVocabulary->elementNameTable) {
                    std::copy(externalVocabulary->elementNameTable, externalVocabulary->elementNameTable + externalVocabulary->elementNameTableSize, std::back_inserter(vocabulary.elementNameTable));
                }
                if (externalVocabulary->attributeNameTable) {
                    std::copy(externalVocabulary->attributeNameTable, externalVocabulary->attributeNameTable + externalVocabulary->attributeNameTableSize, std::back_inserter(vocabulary.attributeNameTable));
                }
            }
            if (b1 & 0x0800) {
                // Parse restricted alphabets (C.2.5.3)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.restrictedAlphabetTable.push_back(parseNonEmptyOctetString2());
                }
            }
            if (b1 & 0x0400) {
                // Parse encoding algorithms (C.2.5.3)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.encodingAlgorithmTable.push_back(parseNonEmptyOctetString2());
                }
            }
            if (b1 & 0x0200) {
                // Parse prefixes (C.2.5.3)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.prefixTable.push_back(parseNonEmptyOctetString2());
                }
            }
            if (b1 & 0x0100) {
                // Parse namespace names (C.2.5.3)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.namespaceNameTable.push_back(parseNonEmptyOctetString2());
                }
            }
            if (b1 & 0x0080) {
                // Parse local names (C.2.5.3)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.localNameTable.push_back(parseNonEmptyOctetString2());
                }
            }
            if (b1 & 0x0040) {
                // Parse other ncnames (C.2.5.3)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.otherNCNameTable.push_back(parseNonEmptyOctetString2());
                }
            }
            if (b1 & 0x0020) {
                // Parse other uris (C.2.5.3)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.otherURITable.push_back(parseNonEmptyOctetString2());
                }
            }
            if (b1 & 0x0010) {
                // Parse attribute values (C.2.5.4)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.attributeValueTable.push_back(parseEncodedCharacterString3());
                }
            }
            if (b1 & 0x0008) {
                // Parse content character chunks (C.2.5.4)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.charactersTable.push_back(parseEncodedCharacterString3());
                }
            }
            if (b1 & 0x0004) {
                // Parse other strings (C.2.5.4)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    if (dataEnd - dataP < 1) {
                        throw DeadlyImportError(parseErrorMessage);
                    }
                    vocabulary.otherStringTable.push_back(parseEncodedCharacterString3());
                }
            }
            if (b1 & 0x0002) {
                // Parse element name surrogates (C.2.5.5)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    vocabulary.elementNameTable.push_back(parseNameSurrogate());
                }
            }
            if (b1 & 0x0001) {
                // Parse attribute name surrogates (C.2.5.5)
                for (size_t len = parseSequenceLen(); len > 0; --len) {
                    vocabulary.attributeNameTable.push_back(parseNameSurrogate());
                }
            }
        }
        if (b & 0x10) {
            // Parse notations (C.2.6)
            for (;;) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                uint8_t b1 = *dataP++;
                if (b1 == 0xf0) {
                    break;
                }
                if ((b1 & 0xfc) != 0xc0) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                /* C.11 */
                /*const std::string &name =*/ parseIdentifyingStringOrIndex(vocabulary.otherNCNameTable);
                if (b1 & 0x02) {
                    /*const std::string &systemId =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                if (b1 & 0x01) {
                    /*const std::string &publicId =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
            }
        }
        if (b & 0x08) {
            // Parse unparsed entities (C.2.7)
            for (;;) {
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                uint8_t b1 = *dataP++;
                if (b1 == 0xf0) {
                    break;
                }
                if ((b1 & 0xfe) != 0xd0) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                /* C.10 */
                /*const std::string &name =*/ parseIdentifyingStringOrIndex(vocabulary.otherNCNameTable);
                /*const std::string &systemId =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                if (b1 & 0x01) {
                    /*const std::string &publicId =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                /*const std::string &notationName =*/ parseIdentifyingStringOrIndex(vocabulary.otherNCNameTable);
            }
        }
        if (b & 0x04) {
            // Parse character encoding scheme (C.2.8)
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            /*std::string characterEncodingScheme =*/ parseNonEmptyOctetString2();
        }
        if (b & 0x02) {
            // Parse standalone flag (C.2.9)
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            uint8_t b1 = *dataP++;
            if (b1 & 0xfe) {
                throw DeadlyImportError(parseErrorMessage);
            }
            //bool standalone = b1 & 0x01;
        }
        if (b & 0x01) {
            // Parse version (C.2.10)
            if (dataEnd - dataP < 1) {
                throw DeadlyImportError(parseErrorMessage);
            }
            /*std::shared_ptr<const FIValue> version =*/ parseNonIdentifyingStringOrIndex1(vocabulary.otherStringTable);
        }
    }